

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O3

size_t ZSTD_decompressContinueStream
                 (ZSTD_DStream *zds,char **op,char *oend,void *src,size_t srcSize)

{
  ZSTD_dStage ZVar1;
  char *pcVar2;
  size_t err_code;
  size_t sVar3;
  ZSTD_dStreamStage ZVar4;
  size_t dstCapacity;
  
  ZVar1 = zds->stage;
  if (zds->outBufferMode == ZSTD_bm_buffered) {
    if (ZVar1 == ZSTDds_skipFrame) {
      sVar3 = zds->outStart;
      dstCapacity = 0;
    }
    else {
      sVar3 = zds->outStart;
      dstCapacity = zds->outBuffSize - sVar3;
    }
    sVar3 = ZSTD_decompressContinue(zds,zds->outBuff + sVar3,dstCapacity,src,srcSize);
    if (0xffffffffffffff88 < sVar3) {
      return sVar3;
    }
    if ((ZVar1 == ZSTDds_skipFrame) || (ZVar4 = zdss_read, sVar3 != 0)) {
      zds->outEnd = zds->outStart + sVar3;
      ZVar4 = zdss_flush;
    }
    zds->streamStage = ZVar4;
  }
  else {
    sVar3 = 0;
    if (ZVar1 != ZSTDds_skipFrame) {
      sVar3 = (long)oend - (long)*op;
    }
    sVar3 = ZSTD_decompressContinue(zds,*op,sVar3,src,srcSize);
    if (0xffffffffffffff88 < sVar3) {
      return sVar3;
    }
    pcVar2 = *op;
    *op = pcVar2 + sVar3;
    zds->streamStage = zdss_read;
    if (oend < pcVar2 + sVar3) {
      __assert_fail("*op <= oend",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                    ,0x7ed,
                    "size_t ZSTD_decompressContinueStream(ZSTD_DStream *, char **, char *, const void *, size_t)"
                   );
    }
    if (zds->outBufferMode != ZSTD_bm_stable) {
      __assert_fail("zds->outBufferMode == ZSTD_bm_stable",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                    ,0x7ee,
                    "size_t ZSTD_decompressContinueStream(ZSTD_DStream *, char **, char *, const void *, size_t)"
                   );
    }
  }
  return 0;
}

Assistant:

static size_t ZSTD_decompressContinueStream(
            ZSTD_DStream* zds, char** op, char* oend,
            void const* src, size_t srcSize) {
    int const isSkipFrame = ZSTD_isSkipFrame(zds);
    if (zds->outBufferMode == ZSTD_bm_buffered) {
        size_t const dstSize = isSkipFrame ? 0 : zds->outBuffSize - zds->outStart;
        size_t const decodedSize = ZSTD_decompressContinue(zds,
                zds->outBuff + zds->outStart, dstSize, src, srcSize);
        FORWARD_IF_ERROR(decodedSize, "");
        if (!decodedSize && !isSkipFrame) {
            zds->streamStage = zdss_read;
        } else {
            zds->outEnd = zds->outStart + decodedSize;
            zds->streamStage = zdss_flush;
        }
    } else {
        /* Write directly into the output buffer */
        size_t const dstSize = isSkipFrame ? 0 : (size_t)(oend - *op);
        size_t const decodedSize = ZSTD_decompressContinue(zds, *op, dstSize, src, srcSize);
        FORWARD_IF_ERROR(decodedSize, "");
        *op += decodedSize;
        /* Flushing is not needed. */
        zds->streamStage = zdss_read;
        assert(*op <= oend);
        assert(zds->outBufferMode == ZSTD_bm_stable);
    }
    return 0;
}